

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_node pugi::impl::anon_unknown_0::xpath_first(xpath_node *begin,xpath_node *end,type_t type)

{
  xpath_node xVar1;
  xpath_node *pxVar2;
  int in_EDX;
  xpath_node *in_RSI;
  xpath_node *in_RDI;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint in_stack_ffffffffffffffd8;
  xml_node local_10;
  xml_attribute local_8;
  
  if (in_RDI == in_RSI) {
    xpath_node::xpath_node
              ((xpath_node *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  else if (in_EDX == 0) {
    pxVar2 = (anonymous_namespace)::
             min_element<pugi::xpath_node_const*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                       (in_RSI,(xpath_node *)(ulong)in_stack_ffffffffffffffd8,
                        (document_order_comparator *)(ulong)in_stack_ffffffffffffffd0);
    local_10._root = (pxVar2->_node)._root;
    local_8._attr = (pxVar2->_attribute)._attr;
  }
  else if (in_EDX == 1) {
    local_10._root = (in_RDI->_node)._root;
    local_8._attr = (in_RDI->_attribute)._attr;
  }
  else if (in_EDX == 2) {
    local_10._root = in_RSI[-1]._node._root;
    local_8._attr = in_RSI[-1]._attribute._attr;
  }
  else {
    xpath_node::xpath_node((xpath_node *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0));
  }
  xVar1._attribute._attr = local_8._attr;
  xVar1._node._root = local_10._root;
  return xVar1;
}

Assistant:

PUGI__FN xpath_node xpath_first(const xpath_node* begin, const xpath_node* end, xpath_node_set::type_t type)
	{
		if (begin == end) return xpath_node();

		switch (type)
		{
		case xpath_node_set::type_sorted:
			return *begin;

		case xpath_node_set::type_sorted_reverse:
			return *(end - 1);

		case xpath_node_set::type_unsorted:
			return *min_element(begin, end, document_order_comparator());

		default:
			assert(false && "Invalid node set type"); // unreachable
			return xpath_node();
		}
	}